

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miam-core.c
# Opt level: O3

la_proto_node * la_miam_core_v1_data_parse(uint8_t *hdrbuf,int hdrlen,uint8_t *bodybuf,int bodylen)

{
  byte bVar1;
  undefined4 uVar2;
  uint uVar3;
  uint uVar4;
  uint32_t uVar5;
  undefined8 *puVar6;
  la_proto_node *plVar7;
  uint8_t *data;
  byte bVar8;
  ulong __n;
  la_inflate_result inflated;
  la_inflate_result local_48;
  
  puVar6 = (undefined8 *)
           la_xcalloc(1,0x80,
                      "/workspace/llm4binary/github/license_c_cmakelists/szpajder[P]libacars/libacars/miam-core.c"
                      ,0x203,"la_miam_core_v1_data_parse");
  plVar7 = la_proto_node_new();
  plVar7->td = &la_DEF_miam_core_v1_data_pdu;
  plVar7->data = puVar6;
  plVar7->next = (la_proto_node *)0x0;
  uVar4 = 8;
  if (0x13 < hdrlen) {
    uVar4 = (uint)hdrbuf[3] | (uint)hdrbuf[2] << 8 | (uint)hdrbuf[1] << 0x10;
    *(uint *)(puVar6 + 1) = uVar4;
    if ((uint)(bodylen + hdrlen) < uVar4) {
      *(byte *)((long)puVar6 + 0x12) = *(byte *)((long)puVar6 + 0x12) | 1;
    }
    uVar2 = *(undefined4 *)(hdrbuf + 4);
    *(undefined4 *)((long)puVar6 + 0x1b) = *(undefined4 *)(hdrbuf + 7);
    *(undefined4 *)(puVar6 + 3) = uVar2;
    *(undefined1 *)((long)puVar6 + 0x1f) = 0;
    *(uint8_t *)((long)puVar6 + 0x27) = hdrbuf[0xb] >> 1;
    *(byte *)(puVar6 + 5) = hdrbuf[0xb] & 1;
    *(byte *)((long)puVar6 + 0x29) = (hdrbuf[0xc] & 1) << 2 | hdrbuf[0xd] >> 6;
    *(byte *)((long)puVar6 + 0x2a) = hdrbuf[0xd] >> 4 & 3;
    bVar1 = hdrbuf[0xd];
    bVar8 = bVar1 & 0xf;
    *(byte *)((long)puVar6 + 0x2b) = bVar8;
    uVar4 = 0x10;
    if (bVar8 < 4) {
      uVar3 = (uint)(0x6060402L >> ((bVar1 & 7) << 3));
      uVar4 = 8;
      if ((uVar3 + 4 & 0xff) <= hdrlen - 0xeU) {
        __n = (ulong)(uVar3 & 6);
        memcpy(puVar6 + 4,hdrbuf + 0xe,__n);
        *(undefined1 *)((long)puVar6 + 0x26) = 0;
        uVar4 = *(uint *)(hdrbuf + 0xe + __n);
        *(uint *)((long)puVar6 + 0x14) =
             uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
        if (bodylen < 1 || bodybuf == (uint8_t *)0x0) {
          return plVar7;
        }
        if (*(char *)((long)puVar6 + 0x29) == '\0') {
          data = (uint8_t *)
                 la_xcalloc((ulong)(bodylen + 1),1,
                            "/workspace/llm4binary/github/license_c_cmakelists/szpajder[P]libacars/libacars/miam-core.c"
                            ,0x259,"la_miam_core_v1_data_parse");
          memcpy(data,bodybuf,(ulong)(uint)bodylen);
          data[(uint)bodylen] = '\0';
          *puVar6 = data;
          *(int *)((long)puVar6 + 0xc) = bodylen;
          local_48.buflen._0_4_ = bodylen;
        }
        else if (*(char *)((long)puVar6 + 0x29) == '\x01') {
          la_inflate(&local_48,bodybuf,bodylen);
          local_48.buf[CONCAT44(local_48.buflen._4_4_,(uint32_t)local_48.buflen)] = '\0';
          *puVar6 = local_48.buf;
          *(uint32_t *)((long)puVar6 + 0xc) = (uint32_t)local_48.buflen;
          data = local_48.buf;
          if (local_48.success == false) {
            *(byte *)((long)puVar6 + 0x12) = *(byte *)((long)puVar6 + 0x12) | 2;
          }
        }
        else {
          *(byte *)((long)puVar6 + 0x12) = *(byte *)((long)puVar6 + 0x12) | 4;
          data = (uint8_t *)*puVar6;
          local_48.buflen._0_4_ = *(uint32_t *)((long)puVar6 + 0xc);
        }
        uVar5 = la_crc32_arinc665(data,(uint32_t)local_48.buflen,0xffffffff);
        uVar4 = 0x80000;
        if ((uVar5 ^ *(uint *)((long)puVar6 + 0x14)) == 0xffffffff) {
          return plVar7;
        }
      }
    }
  }
  *(uint *)(puVar6 + 2) = *(uint *)(puVar6 + 2) | uVar4;
  return plVar7;
}

Assistant:

static la_proto_node *la_miam_core_v1_data_parse(uint8_t const *hdrbuf, int hdrlen, uint8_t const *bodybuf, int bodylen) {
	la_assert(hdrbuf != NULL);

	LA_NEW(la_miam_core_v1_data_pdu, pdu);
	la_proto_node *node = la_proto_node_new();
	node->td = &la_DEF_miam_core_v1_data_pdu;
	node->data = pdu;
	node->next = NULL;

	if(hdrlen < 20) {
		la_debug_print(D_ERROR, "Header too short: %d < 20\n", hdrlen);
		pdu->err |= LA_MIAM_ERR_HDR_TRUNCATED;
		goto end;
	}

	pdu->pdu_len = (hdrbuf[1] << 16) | (hdrbuf[2] << 8) | hdrbuf[3];
	if(pdu->pdu_len > (uint32_t)(hdrlen + bodylen)) {
		la_debug_print(D_ERROR, "PDU truncated: length from header: %d > pdu_len %d (%d+%d)\n",
				pdu->pdu_len, hdrlen + bodylen, hdrlen, bodylen);
		pdu->err |= LA_MIAM_ERR_BODY_TRUNCATED;
	}
	hdrbuf += 4; hdrlen -= 4;

	memcpy(&pdu->aircraft_id, hdrbuf, 7);
	pdu->aircraft_id[7] = '\0';
	la_debug_print(D_INFO, "len: %u aircraft_id: %s\n", pdu->pdu_len, pdu->aircraft_id);
	hdrbuf += 7; hdrlen -= 7;

	uint8_t bytes_needed = 0;
	pdu->msg_num = (hdrbuf[0] >> 1) & 0x7f;
	pdu->ack_option = hdrbuf[0] & 0x1;
	la_debug_print(D_INFO, "msg_num: %u ack_option: %u\n", pdu->msg_num, pdu->ack_option);
	hdrbuf++; hdrlen--;

	pdu->compression = ((hdrbuf[0] << 2) | ((hdrbuf[1] >> 6) & 0x3)) & 0x7;
	pdu->encoding = (hdrbuf[1] >> 4) & 0x3;
	pdu->app_type = hdrbuf[1] & 0xf;
	la_debug_print(D_INFO, "compression: 0x%x encoding: 0x%x app_type: 0x%x\n",
			pdu->compression, pdu->encoding, pdu->app_type);
	hdrbuf += 2; hdrlen -= 2;

	uint8_t app_id_len = 0;
	if(pdu->app_type == LA_MIAM_CORE_V1_APP_ACARS_2CHAR) {
		app_id_len = 2;
	} else if(pdu->app_type == LA_MIAM_CORE_V1_APP_ACARS_4CHAR) {
		app_id_len = 4;
	} else if(pdu->app_type == LA_MIAM_CORE_V1_APP_ACARS_6CHAR ||
			pdu->app_type == LA_MIAM_CORE_V1_APP_NONACARS_6CHAR) {
		app_id_len = 6;
	} else {
		la_debug_print(D_ERROR, "Unknown app type 0x%u\n", pdu->app_type);
		pdu->err |= LA_MIAM_ERR_HDR_APP_TYPE_UNKNOWN;
		goto end;
	}
	bytes_needed = app_id_len + LA_MIAM_CORE_V1_CRC_LEN;
	if(hdrlen < bytes_needed) {
		la_debug_print(D_ERROR, "Header too short for app_type 0x%x: "
				"need %u more bytes but only %u available\n",
				pdu->app_type, bytes_needed, hdrlen);
		pdu->err |= LA_MIAM_ERR_HDR_TRUNCATED;
		goto end;
	}
	memcpy(pdu->app_id, hdrbuf, app_id_len);
	pdu->app_id[6] = '\0';
	la_debug_print(D_INFO, "app_id: '%s'\n", pdu->app_id);
	hdrbuf += app_id_len; hdrlen -= app_id_len;

	pdu->crc = (hdrbuf[0] << 24) | (hdrbuf[1] << 16) | (hdrbuf[2] << 8) | hdrbuf[3];
	hdrbuf += LA_MIAM_CORE_V1_CRC_LEN; hdrlen -= LA_MIAM_CORE_V1_CRC_LEN;
	if(hdrlen > 0) {
		la_debug_print(D_ERROR, "Warning: %u bytes left after MIAM header\n", hdrlen);
	}
	if(bodybuf != NULL && bodylen > 0) {
#ifdef WITH_ZLIB
		if(pdu->compression == LA_MIAM_CORE_V1_COMP_DEFLATE) {
			la_inflate_result inflated = la_inflate(bodybuf, bodylen);
			la_debug_print_buf_hex(D_VERBOSE, inflated.buf, (int)inflated.buflen,
					"Decompressed content:\n");
			// If it's text, it needs a NULL terminator.
			// If it's not text, it doesn't hurt either. The buffer is larger than len anyway.
			inflated.buf[inflated.buflen] = '\0';
			pdu->data = inflated.buf;
			pdu->data_len = inflated.buflen;
			if(inflated.success == false) {
				pdu->err |= LA_MIAM_ERR_BODY_INFLATE_FAILED;
			}
		} else
#endif
			if(pdu->compression == LA_MIAM_CORE_V1_COMP_NONE) {
				uint8_t *pdu_data = LA_XCALLOC(bodylen + 1, sizeof(uint8_t));
				memcpy(pdu_data, bodybuf, bodylen);
				pdu_data[bodylen] = '\0';
				pdu->data = pdu_data;
				pdu->data_len = bodylen;
			} else {
				pdu->err |= LA_MIAM_ERR_BODY_COMPR_UNSUPPORTED;
			}
		uint32_t crc_check = la_crc32_arinc665(pdu->data, pdu->data_len, 0xFFFFFFFFu);
		crc_check = ~crc_check;
		la_debug_print(D_INFO, "crc: %08x crc_check: %08x\n", pdu->crc, crc_check);
		if(crc_check != pdu->crc) {
			pdu->err |= LA_MIAM_ERR_BODY_CRC_FAILED;
		}
	}
end:
	return node;
}